

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O2

void UnitTest::CheckClose<double,double,double>
               (TestResults *results,double *expected,double *actual,double *tolerance,
               TestDetails *details)

{
  ostream *poVar1;
  char *failure;
  MemoryOutStream stream;
  MemoryOutStream MStack_1c8;
  
  if ((*actual < *expected - *tolerance) || (*expected + *tolerance < *actual)) {
    MemoryOutStream::MemoryOutStream(&MStack_1c8);
    std::operator<<((ostream *)&MStack_1c8,"Expected ");
    poVar1 = std::ostream::_M_insert<double>(*expected);
    std::operator<<(poVar1," +/- ");
    poVar1 = std::ostream::_M_insert<double>(*tolerance);
    std::operator<<(poVar1," but was ");
    std::ostream::_M_insert<double>(*actual);
    failure = MemoryOutStream::GetText(&MStack_1c8);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream(&MStack_1c8);
  }
  return;
}

Assistant:

void CheckClose(TestResults& results, Expected const& expected, Actual const& actual, Tolerance const& tolerance,
                TestDetails const& details)
{
    if (!AreClose(expected, actual, tolerance))
    { 
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " +/- " << tolerance << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}